

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-private.h
# Opt level: O0

void __thiscall
Dashel::MemoryPacketStream::MemoryPacketStream
          (MemoryPacketStream *this,void **vtt,string *protocolName)

{
  string *protocolName_local;
  void **vtt_local;
  MemoryPacketStream *this_local;
  
  PacketStream::PacketStream(&this->super_PacketStream,vtt + 1,protocolName);
  (this->super_PacketStream)._vptr_PacketStream = (_func_int **)*vtt;
  *(void **)((long)&(this->super_PacketStream)._vptr_PacketStream +
            (long)(this->super_PacketStream)._vptr_PacketStream[-3]) = vtt[3];
  ExpandableBuffer::ExpandableBuffer((ExpandableBuffer *)&(this->super_PacketStream).field_0x8,0);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->super_PacketStream).field_0x20);
  return;
}

Assistant:

explicit MemoryPacketStream(const std::string& protocolName) :
			Stream(protocolName),
			PacketStream(protocolName) {}